

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

xmlParserInputPtr testExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  stat buf;
  stat64 local_c0;
  
  lVar5 = (long)nb_entities;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)testEntitiesName + lVar6),URL);
      if (iVar1 == 0) {
        pxVar3 = (xmlParserInputPtr)
                 xmlNewStringInputStream(ctxt,*(undefined8 *)((long)testEntitiesValue + lVar6));
        if (pxVar3 != (xmlParserInputPtr)0x0) {
          pcVar4 = (char *)xmlStrdup(*(undefined8 *)((long)testEntitiesName + lVar6));
          pxVar3->filename = pcVar4;
          return pxVar3;
        }
        return (xmlParserInputPtr)0x0;
      }
      lVar6 = lVar6 + 8;
    } while (lVar5 * 8 != lVar6);
  }
  iVar1 = stat64(URL,&local_c0);
  if ((iVar1 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
    pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
    return pxVar3;
  }
  iVar1 = xmlMemUsed();
  pxVar3 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
  iVar2 = xmlMemUsed();
  extraMemoryFromResolver = extraMemoryFromResolver + (iVar2 - iVar1);
  return pxVar3;
}

Assistant:

static xmlParserInputPtr
testExternalEntityLoader(const char *URL, const char *ID,
			 xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr ret;
    int i;

    for (i = 0;i < nb_entities;i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    ret = xmlNewStringInputStream(ctxt,
	                (const xmlChar *) testEntitiesValue[i]);
	    if (ret != NULL) {
	        ret->filename = (const char *)
		                xmlStrdup((xmlChar *)testEntitiesName[i]);
	    }
	    return(ret);
	}
    }
    if (checkTestFile(URL)) {
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
    } else {
	int memused = xmlMemUsed();
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
	extraMemoryFromResolver += xmlMemUsed() - memused;
    }
#if 0
    if (ret == NULL) {
        fprintf(stderr, "Failed to find resource %s\n", URL);
    }
#endif

    return(ret);
}